

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

void av1_pick_recursive_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,int64_t ref_best_rd)

{
  BLOCK_SIZE bsize_00;
  char cVar1;
  TX_SIZE_SEARCH_METHOD TVar2;
  byte bVar3;
  byte tx_size;
  MB_MODE_INFO *pMVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  int64_t iVar9;
  bool bVar10;
  undefined7 uVar11;
  int iVar12;
  uint32_t uVar13;
  int iVar14;
  int64_t iVar15;
  long lVar16;
  int64_t iVar17;
  byte bVar18;
  int iVar19;
  undefined7 in_register_00000009;
  long lVar20;
  uint uVar21;
  int iVar22;
  int idx;
  int iVar23;
  int iVar24;
  int blk_col;
  uint uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int **pp_Var30;
  long lVar31;
  byte bVar32;
  int idy;
  int block;
  int iVar33;
  MB_MODE_INFO *pMVar34;
  long lVar35;
  MB_RD_RECORD *pMVar36;
  MB_RD_INFO *pMVar37;
  double sse_norm;
  FAST_TX_SEARCH_MODE in_stack_fffffffffffffde8;
  uint32_t local_208;
  uint local_1b8;
  uint local_1b0;
  double rate_f;
  long local_190;
  int64_t iStack_188;
  long local_180;
  byte local_178;
  uint local_16c;
  int local_168;
  int local_164;
  undefined8 local_160;
  long local_158;
  int64_t *local_150;
  macroblockd_plane *local_148;
  int64_t dist;
  double dist_by_sse_norm_f;
  TXFM_CONTEXT tx_left [32];
  TXFM_CONTEXT tx_above [32];
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  TXFM_CONTEXT tx_left_1 [32];
  TXFM_CONTEXT tx_above_1 [32];
  ENTROPY_CONTEXT ctxl_1 [32];
  
  local_160 = CONCAT71(in_register_00000009,bsize);
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  lVar28 = (long)(cpi->sf).tx_sf.model_based_prune_tx_search_level;
  if (ref_best_rd != 0x7fffffffffffffff && lVar28 != 0) {
    iVar23 = (x->e_mbd).plane[0].subsampling_x;
    iVar12 = (x->e_mbd).plane[0].subsampling_y;
    bsize_00 = av1_ss_size_lookup[bsize][iVar23][iVar12];
    iVar19 = (x->e_mbd).mb_to_bottom_edge;
    uVar27 = (uint)block_size_high[bsize_00];
    if (iVar19 < 0) {
      uVar21 = (iVar19 >> ((char)iVar12 + 3U & 0x1f)) + (uint)block_size_high[bsize_00];
      uVar27 = 0;
      if (0 < (int)uVar21) {
        uVar27 = uVar21;
      }
    }
    iVar12 = (x->e_mbd).mb_to_right_edge;
    uVar21 = (uint)block_size_wide[bsize_00];
    if (iVar12 < 0) {
      uVar25 = (iVar12 >> ((char)iVar23 + 3U & 0x1f)) + (uint)block_size_wide[bsize_00];
      uVar21 = 0;
      if (0 < (int)uVar25) {
        uVar21 = uVar25;
      }
    }
    iVar23 = (x->e_mbd).bd;
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      pp_Var30 = &aom_sse;
    }
    else {
      pp_Var30 = &aom_highbd_sse;
    }
    cVar1 = (*(x->e_mbd).mi)->ref_frame[0];
    iVar15 = (**pp_Var30)(x->plane[0].src.buf,x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
                          (x->e_mbd).plane[0].dst.stride,uVar21,uVar27);
    bVar32 = (char)iVar23 * '\x02' - 0x10;
    lVar35 = (long)((ulong)((uint)(1 << (bVar32 & 0x1f)) >> 1) + iVar15) >> (bVar32 & 0x3f);
    bVar32 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar32 = (char)(x->e_mbd).bd - 5;
    }
    if (lVar35 == 0) {
      uVar27 = 0;
    }
    else {
      iVar12 = (int)x->plane[0].dequant_QTX[1] >> (bVar32 & 0x1f);
      iVar23 = 1;
      if (1 < iVar12) {
        iVar23 = iVar12;
      }
      dVar5 = (double)(int)(uVar21 * uVar27);
      sse_norm = (double)lVar35 / dVar5;
      dVar6 = log2(sse_norm / ((double)iVar23 * (double)iVar23));
      av1_model_rd_curvfit(bsize_00,sse_norm,dVar6,&rate_f,&dist_by_sse_norm_f);
      dVar6 = (double)CONCAT44(rate_f._4_4_,rate_f._0_4_) * dVar5;
      dVar7 = 0.0;
      if (0.0 <= dVar6) {
        dVar7 = dVar6;
      }
      if ((int)(dVar7 + 0.5) != 0) {
        dVar5 = sse_norm * (double)CONCAT44(dist_by_sse_norm_f._4_4_,dist_by_sse_norm_f._0_4_) *
                dVar5;
        dVar6 = 0.0;
        if (0.0 <= dVar5) {
          dVar6 = dVar5;
        }
        lVar16 = (long)(dVar6 + 0.5) * 0x80 +
                 ((long)x->rdmult * (long)(int)(dVar7 + 0.5) + 0x100 >> 9);
        if (lVar16 < lVar35 * 0x800) {
          lVar31 = 0xffffffff;
          if (lVar35 < 0xffffffff) {
            lVar31 = lVar35;
          }
          x->pred_sse[cVar1] = (uint)lVar31;
          if (ref_best_rd < lVar16 * *(int *)((long)&DAT_0050abc8 + lVar28 * 4 + 4) >> 3) {
            return;
          }
          goto LAB_002369da;
        }
      }
      lVar28 = 0xffffffff;
      if (lVar35 < 0xffffffff) {
        lVar28 = lVar35;
      }
      uVar27 = (uint)lVar28;
    }
    x->pred_sse[cVar1] = uVar27;
  }
LAB_002369da:
  iVar23 = (x->e_mbd).mi_row;
  if ((((iVar23 < (x->e_mbd).tile.mi_row_start) ||
       ((x->e_mbd).tile.mi_row_end <=
        (int)(iVar23 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [bsize]))) ||
      (iVar23 = (x->e_mbd).mi_col, iVar23 < (x->e_mbd).tile.mi_col_start)) ||
     ((x->e_mbd).tile.mi_col_end <=
      (int)(iVar23 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [bsize]))) {
    iVar23 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] - 4 & 0x1f);
LAB_00236b1d:
    bVar10 = false;
    pMVar36 = (MB_RD_RECORD *)0x0;
    local_208 = 0;
  }
  else {
    iVar23 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] - 4 & 0x1f);
    if ((cpi->sf).rd_sf.use_mb_rd_hash == 0) goto LAB_00236b1d;
    uVar13 = (*av1_get_crc32c_value)
                       (&((x->txfm_search_info).mb_rd_record)->crc_calculator,
                        (uint8_t *)x->plane[0].src_diff,
                        (ulong)block_size_wide[bsize] * (ulong)block_size_high[bsize] * 2);
    local_208 = uVar13 * 0x20 + (uint)bsize;
    pMVar36 = (x->txfm_search_info).mb_rd_record;
    bVar10 = true;
    if ((ref_best_rd != 0x7fffffffffffffff) && (iVar12 = pMVar36->num, 0 < iVar12)) {
      iVar19 = pMVar36->index_start;
      do {
        iVar22 = iVar19 % 8;
        if (pMVar36->mb_rd_info[iVar22].hash_value == local_208) {
          if (iVar22 != -1) {
            pMVar34 = *(x->e_mbd).mi;
            pMVar37 = pMVar36->mb_rd_info + iVar22;
            pMVar34->tx_size = pMVar37->tx_size;
            memcpy((x->txfm_search_info).blk_skip,pMVar37->blk_skip,(long)iVar23);
            uVar8 = *(undefined8 *)(pMVar37->inter_tx_size + 8);
            *(undefined8 *)pMVar34->inter_tx_size = *(undefined8 *)pMVar37->inter_tx_size;
            *(undefined8 *)(pMVar34->inter_tx_size + 8) = uVar8;
            memcpy((x->e_mbd).tx_type_map,pMVar36->mb_rd_info[iVar22].tx_type_map,(long)iVar23);
            iVar23 = pMVar36->mb_rd_info[iVar22].rd_stats.zero_rate;
            iVar15 = pMVar36->mb_rd_info[iVar22].rd_stats.dist;
            iVar17 = pMVar36->mb_rd_info[iVar22].rd_stats.rdcost;
            iVar9 = pMVar36->mb_rd_info[iVar22].rd_stats.sse;
            rd_stats->rate = pMVar36->mb_rd_info[iVar22].rd_stats.rate;
            rd_stats->zero_rate = iVar23;
            rd_stats->dist = iVar15;
            rd_stats->rdcost = iVar17;
            rd_stats->sse = iVar9;
            uVar11 = *(undefined7 *)&pMVar36->mb_rd_info[iVar22].rd_stats.field_0x21;
            rd_stats->skip_txfm = pMVar36->mb_rd_info[iVar22].rd_stats.skip_txfm;
            *(undefined7 *)&rd_stats->field_0x21 = uVar11;
            return;
          }
          break;
        }
        iVar19 = iVar19 + 1;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      bVar10 = true;
    }
  }
  if (((x->txfm_search_params).skip_txfm_level == 0) ||
     (iVar12 = predict_skip_txfm(x,bsize,&dist,(uint)(cpi->common).features.reduced_tx_set_used),
     iVar12 == 0)) {
    if (ref_best_rd != 0) {
      TVar2 = (x->txfm_search_params).tx_size_search_method;
      iVar15 = ref_best_rd;
      if (-ref_best_rd != -0x7fffffffffffffff && TVar2 != '\0') {
        lVar28 = 0;
        if (ref_best_rd >> 3 < -ref_best_rd + 0x7fffffffffffffff) {
          lVar28 = ref_best_rd >> 3;
        }
        iVar15 = lVar28 + ref_best_rd;
      }
      local_148 = (x->e_mbd).plane;
      bVar32 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
      bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
      av1_get_entropy_contexts(bsize,local_148,ctxa,ctxl);
      memcpy(tx_above,(x->e_mbd).above_txfm_context,(ulong)bVar32);
      memcpy(tx_left,(x->e_mbd).left_txfm_context,(ulong)bVar3);
      iVar12 = 2;
      if (((x->txfm_search_params).tx_size_search_method != '\x02') &&
         ((2 < (byte)((char)local_160 - 0xdU) || ((cpi->sf).tx_sf.tx_size_search_lgr_block == 0))))
      {
        iVar12 = (&((TX_SPEED_FEATURES *)(&(cpi->sf).intra_sf + 1))->
                   inter_tx_size_search_init_depth_sqr)[bVar3 != bVar32];
      }
      tx_size = ""[bsize];
      pMVar34 = (x->e_mbd).left_mbmi;
      pMVar4 = (x->e_mbd).above_mbmi;
      if (pMVar4 == (MB_MODE_INFO *)0x0) {
        uVar27 = 0;
      }
      else {
        uVar27 = (uint)pMVar4->skip_txfm;
      }
      local_168 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      iVar19 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      local_150 = &rd_stats->dist;
      lVar28 = 0;
      if (pMVar34 == (MB_MODE_INFO *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (uint)pMVar34->skip_txfm;
      }
      local_164 = iVar19 * local_168;
      local_158 = (long)(x->mode_costs).skip_txfm_cost[uVar21 + uVar27][0];
      lVar20 = (long)(x->mode_costs).skip_txfm_cost[uVar21 + uVar27][1];
      lVar26 = x->rdmult * lVar20 + 0x100 >> 9;
      lVar16 = x->rdmult * local_158 + 0x100 >> 9;
      rd_stats->rate = 0;
      *local_150 = 0;
      rd_stats->rdcost = 0;
      rd_stats->sse = 0;
      rd_stats->skip_txfm = '\x01';
      rd_stats->zero_rate = 0;
      lVar35 = 0;
      lVar31 = 0;
      iVar24 = 0;
      iVar22 = 0;
      local_16c = (uint)block_size_high[bsize];
      while( true ) {
        iVar14 = (int)lVar28;
        iVar33 = (x->e_mbd).mb_to_bottom_edge;
        uVar27 = local_16c;
        if (iVar33 < 0) {
          uVar27 = (iVar33 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f)) + local_16c;
        }
        if ((int)uVar27 >> 2 <= iVar22) break;
        bVar18 = block_size_wide[bsize];
        iVar33 = 0;
        while( true ) {
          iVar14 = (x->e_mbd).mb_to_right_edge;
          uVar27 = (uint)bVar18;
          if (iVar14 < 0) {
            uVar27 = (iVar14 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f)) +
                     (uint)bVar18;
          }
          if ((int)uVar27 >> 2 <= iVar33) break;
          if (lVar26 < lVar16) {
            lVar16 = lVar26;
          }
          iVar17 = iVar15 - lVar16;
          if (iVar15 == 0x7fffffffffffffff) {
            iVar17 = 0x7fffffffffffffff;
          }
          dist_by_sse_norm_f._0_4_ = 1;
          select_tx_block(cpi,x,iVar22,iVar33,iVar24,tx_size,iVar12,bsize,ctxa,ctxl,tx_above,tx_left
                          ,(RD_STATS *)&rate_f,0x7fffffffffffffff,iVar17,(int *)&dist_by_sse_norm_f,
                          TVar2 != '\0');
          if ((dist_by_sse_norm_f._0_4_ == 0) || (rate_f._0_4_ == 0x7fffffff)) {
            rd_stats->rate = 0x7fffffff;
            goto LAB_0023705e;
          }
          if ((long)rd_stats->rate == 0x7fffffff) {
            lVar31 = 0x7fffffffffffffff;
            rd_stats->dist = 0x7fffffffffffffff;
            rd_stats->rdcost = 0x7fffffffffffffff;
            rd_stats->sse = 0x7fffffffffffffff;
            rd_stats->skip_txfm = '\0';
            rd_stats->zero_rate = 0;
            lVar28 = 0x7fffffff;
            lVar35 = 0x7fffffffffffffff;
          }
          else {
            lVar28 = (long)rd_stats->rate + (long)rate_f._0_4_;
            if (0x7ffffffe < lVar28) {
              lVar28 = 0x7fffffff;
            }
            rd_stats->rate = (int)lVar28;
            if (rd_stats->zero_rate == 0) {
              rd_stats->zero_rate = rate_f._4_4_;
            }
            lVar35 = rd_stats->dist + local_190;
            lVar16 = rd_stats->sse;
            rd_stats->dist = lVar35;
            lVar31 = 0x7fffffffffffffff;
            if ((lVar16 != 0x7fffffffffffffff) && (lVar31 = lVar16, local_180 != 0x7fffffffffffffff)
               ) {
              rd_stats->sse = local_180 + lVar16;
              lVar31 = local_180 + lVar16;
            }
            rd_stats->skip_txfm = rd_stats->skip_txfm & local_178;
          }
          lVar26 = lVar31 * 0x80 + (x->rdmult * lVar20 + 0x100 >> 9);
          lVar16 = lVar35 * 0x80 +
                   ((long)((int)local_158 + (int)lVar28) * (long)x->rdmult + 0x100 >> 9);
          iVar24 = iVar24 + local_164;
          iVar33 = iVar33 + iVar19;
        }
        iVar22 = iVar22 + local_168;
      }
      if (iVar14 != 0x7fffffff) {
        bVar18 = lVar26 <= lVar16;
        rd_stats->skip_txfm = lVar26 <= lVar16;
        if ((TVar2 == '\0') || ((cpi->sf).tx_sf.refine_fast_tx_search_results == 0)) {
LAB_0023759a:
          if (bVar18 == 0) {
            lVar28 = lVar35 * 0x80 +
                     ((long)(iVar14 + (int)local_158) * (long)x->rdmult + 0x100 >> 9);
            if (((x->e_mbd).lossless[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] == 0) &&
               (lVar35 = lVar31 * 0x80 + (x->rdmult * lVar20 + 0x100 >> 9), lVar35 <= lVar28)) {
              lVar28 = lVar35;
            }
          }
          else {
            lVar28 = lVar31 * 0x80 + (x->rdmult * lVar20 + 0x100 >> 9);
          }
          if (lVar28 != 0x7fffffffffffffff) {
            if (!bVar10) {
              return;
            }
            iVar12 = pMVar36->index_start;
            iVar19 = pMVar36->num;
            if (iVar19 < 8) {
              uVar21 = iVar12 + iVar19;
              uVar27 = iVar12 + iVar19 + 7;
              if (-1 < (int)uVar21) {
                uVar27 = uVar21;
              }
              iVar12 = uVar21 - (uVar27 & 0xfffffff8);
              pMVar36->num = iVar19 + 1;
            }
            else {
              uVar27 = iVar12 + 8;
              if (-1 < (int)(iVar12 + 1U)) {
                uVar27 = iVar12 + 1U;
              }
              pMVar36->index_start = (iVar12 - (uVar27 & 0xfffffff8)) + 1;
            }
            lVar28 = (long)iVar12;
            pMVar34 = *(x->e_mbd).mi;
            pMVar37 = pMVar36->mb_rd_info + lVar28;
            pMVar37->hash_value = local_208;
            goto LAB_002370e7;
          }
        }
        else {
          if (-1 < ref_best_rd) {
            rd_stats->rate = 0;
            *local_150 = 0;
            local_150[1] = 0;
            local_150[2] = 0;
            rd_stats->skip_txfm = '\x01';
            rd_stats->zero_rate = 0;
            uVar27 = (uint)tx_size;
            if ((x->e_mbd).lossless[*(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7] != 0) {
              uVar27 = 0;
            }
            iVar12 = *(int *)((long)tx_size_high_unit + (ulong)(uVar27 << 2));
            iVar19 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar27 << 2));
            iVar22 = 2;
            if (((x->txfm_search_params).tx_size_search_method != '\x02') &&
               ((2 < (byte)((char)local_160 - 0xdU) ||
                ((cpi->sf).tx_sf.tx_size_search_lgr_block == 0)))) {
              iVar22 = (&((TX_SPEED_FEATURES *)(&(cpi->sf).intra_sf + 1))->
                         inter_tx_size_search_init_depth_sqr)[bVar3 != bVar32];
            }
            av1_get_entropy_contexts(bsize,local_148,(ENTROPY_CONTEXT *)&dist_by_sse_norm_f,ctxl_1);
            memcpy(tx_above_1,(x->e_mbd).above_txfm_context,(ulong)bVar32);
            memcpy(tx_left_1,(x->e_mbd).left_txfm_context,(ulong)bVar3);
            lVar28 = 0;
            iVar24 = 0;
            iVar33 = 0;
            do {
              blk_col = 0;
              do {
                rate_f._0_4_ = 0;
                local_190 = 0;
                iStack_188 = 0;
                local_180 = 0;
                local_178 = 1;
                rate_f._4_4_ = 0;
                tx_block_yrd(cpi,x,iVar24,blk_col,iVar33,(TX_SIZE)uVar27,bsize,iVar22,
                             (ENTROPY_CONTEXT *)&dist_by_sse_norm_f,ctxl_1,tx_above_1,tx_left_1,
                             ref_best_rd - lVar28,(RD_STATS *)&rate_f,in_stack_fffffffffffffde8);
                lVar16 = (long)rate_f._0_4_;
                if (lVar16 == 0x7fffffff) goto LAB_00237755;
                if ((long)rd_stats->rate == 0x7fffffff) {
                  lVar31 = 0x7fffffffffffffff;
                  rd_stats->dist = 0x7fffffffffffffff;
                  rd_stats->rdcost = 0x7fffffffffffffff;
                  rd_stats->sse = 0x7fffffffffffffff;
                  rd_stats->skip_txfm = '\0';
                  rd_stats->zero_rate = 0;
                  iVar14 = 0x7fffffff;
                  bVar18 = 0;
                  lVar35 = 0x7fffffffffffffff;
                }
                else {
                  lVar35 = rd_stats->rate + lVar16;
                  if (0x7ffffffe < lVar35) {
                    lVar35 = 0x7fffffff;
                  }
                  iVar14 = (int)lVar35;
                  rd_stats->rate = iVar14;
                  if (rd_stats->zero_rate == 0) {
                    rd_stats->zero_rate = rate_f._4_4_;
                  }
                  lVar35 = rd_stats->dist + local_190;
                  rd_stats->dist = lVar35;
                  lVar26 = rd_stats->sse;
                  lVar31 = 0x7fffffffffffffff;
                  if ((lVar26 != 0x7fffffffffffffff) &&
                     (lVar31 = lVar26, local_180 != 0x7fffffffffffffff)) {
                    rd_stats->sse = local_180 + lVar26;
                    lVar31 = local_180 + lVar26;
                  }
                  bVar18 = rd_stats->skip_txfm & local_178;
                  rd_stats->skip_txfm = bVar18;
                }
                lVar26 = (long)x->rdmult;
                lVar29 = local_190 * 0x80 + (lVar16 * lVar26 + 0x100 >> 9);
                lVar16 = local_180 * 0x80 + (rate_f._4_4_ * lVar26 + 0x100 >> 9);
                if (lVar29 < lVar16) {
                  lVar16 = lVar29;
                }
                lVar28 = lVar28 + lVar16;
                iVar33 = iVar33 + iVar19 * iVar12;
                blk_col = blk_col + iVar19;
                local_1b0 = (uint)bVar32;
              } while (blk_col < (int)local_1b0);
              iVar24 = iVar24 + iVar12;
              local_1b8 = (uint)bVar3;
            } while (iVar24 < (int)local_1b8);
            pMVar34 = (x->e_mbd).left_mbmi;
            pMVar4 = (x->e_mbd).above_mbmi;
            if (pMVar4 == (MB_MODE_INFO *)0x0) {
              uVar27 = 0;
            }
            else {
              uVar27 = (uint)pMVar4->skip_txfm;
            }
            if (pMVar34 == (MB_MODE_INFO *)0x0) {
              uVar21 = 0;
            }
            else {
              uVar21 = (uint)pMVar34->skip_txfm;
            }
            lVar16 = lVar31 * 0x80 +
                     ((x->mode_costs).skip_txfm_cost[uVar21 + uVar27][1] * lVar26 + 0x100 >> 9);
            lVar28 = lVar35 * 0x80 +
                     (((long)iVar14 + (long)(x->mode_costs).skip_txfm_cost[uVar21 + uVar27][0]) *
                      lVar26 + 0x100 >> 9);
            if (lVar16 < lVar28) {
              rd_stats->rate = 0;
              rd_stats->dist = lVar31;
              rd_stats->skip_txfm = '\x01';
              bVar18 = 1;
              iVar14 = 0;
              lVar35 = lVar31;
              lVar28 = lVar16;
            }
            if (ref_best_rd < lVar28) goto LAB_0023759a;
          }
LAB_00237755:
          rd_stats->rate = 0x7fffffff;
          rd_stats->zero_rate = 0;
LAB_0023705e:
          rd_stats->dist = 0x7fffffffffffffff;
          rd_stats->rdcost = 0x7fffffffffffffff;
          rd_stats->sse = 0x7fffffffffffffff;
          rd_stats->skip_txfm = '\0';
        }
      }
    }
    rd_stats->rate = 0x7fffffff;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
  }
  else {
    set_skip_txfm(x,rd_stats,bsize,dist);
    if (!bVar10) {
      return;
    }
    iVar12 = pMVar36->index_start;
    iVar19 = pMVar36->num;
    if (iVar19 < 8) {
      uVar21 = iVar12 + iVar19;
      uVar27 = iVar12 + iVar19 + 7;
      if (-1 < (int)uVar21) {
        uVar27 = uVar21;
      }
      iVar12 = uVar21 - (uVar27 & 0xfffffff8);
      pMVar36->num = iVar19 + 1;
    }
    else {
      uVar27 = iVar12 + 8;
      if (-1 < (int)(iVar12 + 1U)) {
        uVar27 = iVar12 + 1U;
      }
      pMVar36->index_start = (iVar12 - (uVar27 & 0xfffffff8)) + 1;
    }
    lVar28 = (long)iVar12;
    pMVar34 = *(x->e_mbd).mi;
    pMVar37 = pMVar36->mb_rd_info + lVar28;
    pMVar37->hash_value = local_208;
LAB_002370e7:
    pMVar37->tx_size = pMVar34->tx_size;
    memcpy(pMVar37->blk_skip,(x->txfm_search_info).blk_skip,(long)iVar23);
    uVar8 = *(undefined8 *)(pMVar34->inter_tx_size + 8);
    *(undefined8 *)pMVar37->inter_tx_size = *(undefined8 *)pMVar34->inter_tx_size;
    *(undefined8 *)(pMVar37->inter_tx_size + 8) = uVar8;
    memcpy(pMVar36->mb_rd_info[lVar28].tx_type_map,(x->e_mbd).tx_type_map,(long)iVar23);
    iVar23 = rd_stats->zero_rate;
    iVar15 = rd_stats->dist;
    iVar17 = rd_stats->rdcost;
    iVar9 = rd_stats->sse;
    pMVar36->mb_rd_info[lVar28].rd_stats.rate = rd_stats->rate;
    pMVar36->mb_rd_info[lVar28].rd_stats.zero_rate = iVar23;
    pMVar36->mb_rd_info[lVar28].rd_stats.dist = iVar15;
    pMVar36->mb_rd_info[lVar28].rd_stats.rdcost = iVar17;
    pMVar36->mb_rd_info[lVar28].rd_stats.sse = iVar9;
    uVar11 = *(undefined7 *)&rd_stats->field_0x21;
    pMVar36->mb_rd_info[lVar28].rd_stats.skip_txfm = rd_stats->skip_txfm;
    *(undefined7 *)&pMVar36->mb_rd_info[lVar28].rd_stats.field_0x21 = uVar11;
  }
  return;
}

Assistant:

void av1_pick_recursive_tx_size_type_yrd(const AV1_COMP *cpi, MACROBLOCK *x,
                                         RD_STATS *rd_stats, BLOCK_SIZE bsize,
                                         int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  assert(is_inter_block(xd->mi[0]));

  av1_invalid_rd_stats(rd_stats);

  // If modeled RD cost is a lot worse than the best so far, terminate early.
  if (cpi->sf.tx_sf.model_based_prune_tx_search_level &&
      ref_best_rd != INT64_MAX) {
    if (model_based_tx_search_prune(cpi, x, bsize, ref_best_rd)) return;
  }

  // Hashing based speed feature. If the hash of the prediction residue block is
  // found in the hash table, use previous search results and terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int mi_row = x->e_mbd.mi_row;
  const int mi_col = x->e_mbd.mi_col;
  const int within_border =
      mi_row >= xd->tile.mi_row_start &&
      (mi_row + mi_size_high[bsize] < xd->tile.mi_row_end) &&
      mi_col >= xd->tile.mi_col_start &&
      (mi_col + mi_size_wide[bsize] < xd->tile.mi_col_end);
  const int is_mb_rd_hash_enabled =
      (within_border && cpi->sf.rd_sf.use_mb_rd_hash);
  const int n4 = bsize_to_num_blk(bsize);
  if (is_mb_rd_hash_enabled) {
    hash = get_block_residue_hash(x, bsize);
    mb_rd_record = x->txfm_search_info.mb_rd_record;
    const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
    if (match_index != -1) {
      MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
      fetch_mb_rd_info(n4, mb_rd_info, rd_stats, x);
      return;
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (txfm_params->skip_txfm_level &&
      predict_skip_txfm(x, bsize, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    set_skip_txfm(x, rd_stats, bsize, dist);
    // Save the RD search results into mb_rd_record.
    if (is_mb_rd_hash_enabled)
      save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
    return;
  }
#if CONFIG_SPEED_STATS
  ++x->txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS

  const int64_t rd =
      select_tx_size_and_type(cpi, x, rd_stats, bsize, ref_best_rd);

  if (rd == INT64_MAX) {
    // We should always find at least one candidate unless ref_best_rd is less
    // than INT64_MAX (in which case, all the calls to select_tx_size_fix_type
    // might have failed to find something better)
    assert(ref_best_rd != INT64_MAX);
    av1_invalid_rd_stats(rd_stats);
    return;
  }

  // Save the RD search results into mb_rd_record.
  if (is_mb_rd_hash_enabled) {
    assert(mb_rd_record != NULL);
    save_mb_rd_info(n4, hash, x, rd_stats, mb_rd_record);
  }
}